

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# aq_variance.c
# Opt level: O0

int av1_log_block_var(AV1_COMP *cpi,MACROBLOCK *x,BLOCK_SIZE bs)

{
  code *pcVar1;
  int iVar2;
  uint uVar3;
  byte in_DL;
  long in_RSI;
  long *in_RDI;
  double dVar4;
  aom_variance_fn_t vf;
  int bh;
  int bw;
  int bottom_overflow;
  int right_overflow;
  int j;
  int i;
  uint sse;
  double var;
  MACROBLOCKD *xd;
  int local_58;
  int local_54;
  int local_34;
  int local_30;
  undefined1 local_2c [4];
  double local_28;
  MACROBLOCKD *local_20;
  long local_10;
  
  local_20 = (MACROBLOCKD *)(in_RSI + 0x1a0);
  local_28 = 0.0;
  if (*(int *)(in_RSI + 0x2098) < 0) {
    local_54 = -*(int *)(in_RSI + 0x2098) >> 3;
  }
  else {
    local_54 = 0;
  }
  if (*(int *)(in_RSI + 0x20a0) < 0) {
    local_58 = -*(int *)(in_RSI + 0x20a0) >> 3;
  }
  else {
    local_58 = 0;
  }
  local_54 = (uint)"\x01\x01\x02\x02\x02\x04\x04\x04\b\b\b\x10\x10\x10  \x01\x04\x02\b\x04\x10"
                   [in_DL] * 4 - local_54;
  local_58 = (uint)"\x01\x02\x01\x02\x04\x02\x04\b\x04\b\x10\b\x10 \x10 \x04\x01\b\x02\x10\x04"
                   [in_DL] * 4 - local_58;
  pcVar1 = *(code **)(*in_RDI + 0xc918);
  local_10 = in_RSI;
  for (local_30 = 0; local_30 < local_58; local_30 = local_30 + 4) {
    for (local_34 = 0; local_34 < local_54; local_34 = local_34 + 4) {
      iVar2 = is_cur_buf_hbd(local_20);
      if (iVar2 == 0) {
        uVar3 = (*pcVar1)(*(long *)(local_10 + 0x30) + (long)(local_30 * *(int *)(local_10 + 0x48))
                          + (long)local_34,*(int *)(local_10 + 0x48),"",0,local_2c);
        dVar4 = log1p((double)uVar3 / 16.0);
        local_28 = dVar4 + local_28;
      }
      else {
        uVar3 = (*pcVar1)(*(long *)(local_10 + 0x30) + (long)(local_30 * *(int *)(local_10 + 0x48))
                          + (long)local_34,*(int *)(local_10 + 0x48),0x60b6c0,0,local_2c);
        dVar4 = log1p((double)uVar3 / 16.0);
        local_28 = dVar4 + local_28;
      }
    }
  }
  local_28 = local_28 / (double)(((local_54 / 4) * local_58) / 4);
  if (7.0 < local_28) {
    local_28 = 7.0;
  }
  return (int)local_28;
}

Assistant:

int av1_log_block_var(const AV1_COMP *cpi, const MACROBLOCK *x, BLOCK_SIZE bs) {
  DECLARE_ALIGNED(16, static const uint16_t,
                  av1_highbd_all_zeros[MAX_SB_SIZE]) = { 0 };
  DECLARE_ALIGNED(16, static const uint8_t, av1_all_zeros[MAX_SB_SIZE]) = { 0 };

  // This function returns a score for the blocks local variance as calculated
  // by: sum of the log of the (4x4 variances) of each subblock to the current
  // block (x,bs)
  // * 32 / number of pixels in the block_size.
  // This is used for segmentation because to avoid situations in which a large
  // block with a gentle gradient gets marked high variance even though each
  // subblock has a low variance.   This allows us to assign the same segment
  // number for the same sorts of area regardless of how the partitioning goes.

  const MACROBLOCKD *xd = &x->e_mbd;
  double var = 0;
  unsigned int sse;
  int i, j;

  int right_overflow =
      (xd->mb_to_right_edge < 0) ? ((-xd->mb_to_right_edge) >> 3) : 0;
  int bottom_overflow =
      (xd->mb_to_bottom_edge < 0) ? ((-xd->mb_to_bottom_edge) >> 3) : 0;

  const int bw = MI_SIZE * mi_size_wide[bs] - right_overflow;
  const int bh = MI_SIZE * mi_size_high[bs] - bottom_overflow;

  aom_variance_fn_t vf = cpi->ppi->fn_ptr[BLOCK_4X4].vf;
  for (i = 0; i < bh; i += 4) {
    for (j = 0; j < bw; j += 4) {
      if (is_cur_buf_hbd(xd)) {
        var += log1p(vf(x->plane[0].src.buf + i * x->plane[0].src.stride + j,
                        x->plane[0].src.stride,
                        CONVERT_TO_BYTEPTR(av1_highbd_all_zeros), 0, &sse) /
                     16.0);
      } else {
        var += log1p(vf(x->plane[0].src.buf + i * x->plane[0].src.stride + j,
                        x->plane[0].src.stride, av1_all_zeros, 0, &sse) /
                     16.0);
      }
    }
  }
  // Use average of 4x4 log variance. The range for 8 bit 0 - 9.704121561.
  var /= (bw / 4 * bh / 4);
  if (var > 7) var = 7;

  return (int)(var);
}